

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

bool __thiscall AllDiffDomain<0>::check(AllDiffDomain<0> *this)

{
  uint uVar1;
  uint uVar2;
  void *__s;
  ulong uVar3;
  IntView<0> *pIVar4;
  long lVar5;
  ulong __n;
  bool bVar6;
  
  uVar1 = this->sz;
  __n = (ulong)uVar1;
  if (__n == 0) {
    bVar6 = true;
  }
  else {
    uVar2 = 0xffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    __s = operator_new__((long)(int)uVar2);
    if (0 < (int)uVar1) {
      memset(__s,0,__n);
    }
    bVar6 = (int)uVar1 < 1;
    if (0 < (int)uVar1) {
      pIVar4 = this->x;
      uVar3 = 0;
      do {
        lVar5 = (long)(&pIVar4->var->min)[(ulong)pIVar4->var->in_scip * 4].v;
        if (*(char *)((long)__s + lVar5) != '\0') {
          bVar6 = false;
          goto LAB_0015a285;
        }
        *(undefined1 *)((long)__s + lVar5) = 1;
        uVar3 = uVar3 + 1;
        pIVar4 = pIVar4 + 1;
      } while (__n != uVar3);
      bVar6 = __n <= uVar3;
    }
LAB_0015a285:
    operator_delete__(__s);
  }
  return bVar6;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}